

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O2

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::acquire
          (Fasttrack<std::shared_mutex> *this,tls_t tls,void *mutex,int recursive,bool write)

{
  anon_union_8_1_a8a14541_for_iterator_1 aVar1;
  iterator iVar2;
  void *local_20;
  
  if (recursive < 2) {
    local_20 = mutex;
    std::__shared_mutex_pthread::lock(&(this->g_lock)._M_impl);
    iVar2 = phmap::container_internal::
            raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,phmap::container_internal::HashEq<void*,void>::Hash,phmap::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
            ::find<void*>((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                           *)&this->locks,&local_20);
    aVar1 = iVar2.field_1;
    if (iVar2.ctrl_ ==
        (this->locks).
        super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
        .
        super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
        .ctrl_ + (this->locks).
                 super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                 .
                 super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                 .capacity_) {
      iVar2 = createLock(this,local_20);
      aVar1 = iVar2.field_1;
    }
    VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::update
              ((VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *)tls,
               (VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *)
               ((long)aVar1.slot_ + 8));
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->g_lock);
  }
  return;
}

Assistant:

void acquire(tls_t tls, void* mutex, int recursive, bool write) final {
    if (recursive >
        1) {   // lock haven't been updated by another thread (by definition)
      return;  // therefore no action needed here as only the invoking thread
               // may have updated the lock
    }

    std::lock_guard<LockT> exLockT(g_lock);
    auto it = locks.find(mutex);
    if (it == locks.end()) {
      it = createLock(mutex);
    }
    ThreadState* thr = reinterpret_cast<ThreadState*>(tls);
    (thr)->update(it->second);
  }